

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

void __thiscall
dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
          (DGLLVMPointerAnalysis *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  pointer pcVar2;
  LLVMPointerGraphBuilder *this_01;
  LLVMPointerAnalysisOptions local_a0;
  
  paVar1 = &local_a0.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar2 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  local_a0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,
             pcVar2 + (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length);
  local_a0.super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  this_00 = &local_a0.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_00->_M_t,
             &(opts->super_PointerAnalysisOptions).super_AnalysisOptions.allocationFunctions._M_t);
  local_a0.super_PointerAnalysisOptions.preprocessGeps =
       (opts->super_PointerAnalysisOptions).preprocessGeps;
  local_a0.super_PointerAnalysisOptions.invalidateNodes =
       (opts->super_PointerAnalysisOptions).invalidateNodes;
  local_a0.super_PointerAnalysisOptions._58_6_ =
       *(undefined6 *)&(opts->super_PointerAnalysisOptions).field_0x3a;
  local_a0.super_PointerAnalysisOptions.maxIterations =
       (opts->super_PointerAnalysisOptions).maxIterations;
  local_a0.analysisType = opts->analysisType;
  local_a0.threads = opts->threads;
  LLVMPointerAnalysis::LLVMPointerAnalysis(&this->super_LLVMPointerAnalysis,&local_a0);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_a0.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions._M_t.
             _M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_a0.super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity +
                    1);
  }
  (this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis =
       (_func_int **)&PTR_hasPointsTo_00118800;
  this->PS = (PointerGraph *)0x0;
  (this->PTA)._M_t.
  super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
  .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl = (PointerAnalysis *)0x0;
  this_01 = (LLVMPointerGraphBuilder *)operator_new(0x228);
  pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder(this_01,m,opts);
  (this->_builder)._M_t.
  super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl = this_01;
  return;
}

Assistant:

DGLLVMPointerAnalysis(const llvm::Module *m,
                          const LLVMPointerAnalysisOptions opts)
            : LLVMPointerAnalysis(opts),
              _builder(new LLVMPointerGraphBuilder(m, opts)) {}